

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void decodeGeneric(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  bool bVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  long in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  long *in_RDI;
  uchar *in_R8;
  LodePNGDecompressSettings *in_R9;
  size_t bpp_1;
  size_t bpp;
  size_t newsize;
  uchar *data;
  uint chunkLength;
  uint critical_pos;
  uint unknown;
  size_t outsize;
  size_t expected_size;
  size_t scanlines_size;
  uchar *scanlines;
  size_t idatsize;
  uchar *idat;
  uchar *chunk;
  uchar IEND;
  undefined7 in_stack_ffffffffffffff58;
  byte bVar7;
  uchar *in_stack_ffffffffffffff60;
  LodePNGColorMode *in_stack_ffffffffffffff68;
  LodePNGDecompressSettings *in_stack_ffffffffffffff70;
  LodePNGState *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  undefined4 uVar8;
  uint uVar9;
  LodePNGInfo *info;
  LodePNGInfo *zlibsettings;
  long lVar10;
  LodePNGInfo *info_00;
  LodePNGDecompressSettings *zlibsettings_00;
  LodePNGInfo *info_01;
  uchar *local_40;
  
  bVar1 = false;
  info_01 = (LodePNGInfo *)0x0;
  zlibsettings_00 = (LodePNGDecompressSettings *)0x0;
  info_00 = (LodePNGInfo *)0x0;
  zlibsettings = (LodePNGInfo *)0x0;
  info = (LodePNGInfo *)0x0;
  uVar9 = 0;
  uVar8 = 1;
  *in_RDI = 0;
  *in_RDX = 0;
  *in_RSI = 0;
  uVar3 = lodepng_inspect((uint *)0x1,
                          (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78,(uchar *)in_stack_ffffffffffffff70,
                          (size_t)in_stack_ffffffffffffff68);
  *(uint *)(in_RCX + 0x1f0) = uVar3;
  if (*(int *)(in_RCX + 0x1f0) == 0) {
    iVar4 = lodepng_pixel_overflow
                      ((uint)info,uVar9,
                       (LodePNGColorMode *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (LodePNGColorMode *)in_stack_ffffffffffffff78);
    if (iVar4 == 0) {
      pvVar5 = lodepng_malloc(0x168392);
      if (pvVar5 != (void *)0x0) {
        local_40 = in_R8 + 0x21;
        do {
          bVar7 = 0;
          if (!bVar1) {
            bVar7 = *(int *)(in_RCX + 0x1f0) != 0 ^ 0xff;
          }
          if ((bVar7 & 1) == 0) goto LAB_00168bcb;
          if ((in_R9 < (LodePNGDecompressSettings *)(local_40 + (0xc - (long)in_R8))) ||
             (local_40 < in_R8)) {
            if (*(int *)(in_RCX + 0x28) == 0) {
              *(undefined4 *)(in_RCX + 0x1f0) = 0x1e;
            }
            goto LAB_00168bcb;
          }
          in_stack_ffffffffffffff84 = lodepng_chunk_length((uchar *)0x168457);
          if (0x7fffffff < in_stack_ffffffffffffff84) {
            if (*(int *)(in_RCX + 0x28) == 0) {
              *(undefined4 *)(in_RCX + 0x1f0) = 0x3f;
            }
            goto LAB_00168bcb;
          }
          if ((in_R9 < (LodePNGDecompressSettings *)
                       (local_40 + ((ulong)in_stack_ffffffffffffff84 - (long)in_R8) + 0xc)) ||
             (local_40 + (ulong)in_stack_ffffffffffffff84 + 0xc < in_R8)) {
            *(undefined4 *)(in_RCX + 0x1f0) = 0x40;
            goto LAB_00168bcb;
          }
          in_stack_ffffffffffffff78 = (LodePNGState *)lodepng_chunk_data_const(local_40);
          uVar9 = 0;
          uVar2 = lodepng_chunk_type_equals
                            ((uchar *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60);
          if (uVar2 == '\0') {
            uVar2 = lodepng_chunk_type_equals
                              ((uchar *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60)
            ;
            if (uVar2 == '\0') {
              uVar2 = lodepng_chunk_type_equals
                                ((uchar *)in_stack_ffffffffffffff68,
                                 (char *)in_stack_ffffffffffffff60);
              if (uVar2 == '\0') {
                uVar2 = lodepng_chunk_type_equals
                                  ((uchar *)in_stack_ffffffffffffff68,
                                   (char *)in_stack_ffffffffffffff60);
                if (uVar2 == '\0') {
                  uVar2 = lodepng_chunk_type_equals
                                    ((uchar *)in_stack_ffffffffffffff68,
                                     (char *)in_stack_ffffffffffffff60);
                  if (uVar2 == '\0') {
                    uVar2 = lodepng_chunk_type_equals
                                      ((uchar *)in_stack_ffffffffffffff68,
                                       (char *)in_stack_ffffffffffffff60);
                    if (uVar2 == '\0') {
                      uVar2 = lodepng_chunk_type_equals
                                        ((uchar *)in_stack_ffffffffffffff68,
                                         (char *)in_stack_ffffffffffffff60);
                      if (uVar2 == '\0') {
                        uVar2 = lodepng_chunk_type_equals
                                          ((uchar *)in_stack_ffffffffffffff68,
                                           (char *)in_stack_ffffffffffffff60);
                        if (uVar2 == '\0') {
                          uVar2 = lodepng_chunk_type_equals
                                            ((uchar *)in_stack_ffffffffffffff68,
                                             (char *)in_stack_ffffffffffffff60);
                          if (uVar2 == '\0') {
                            uVar2 = lodepng_chunk_type_equals
                                              ((uchar *)in_stack_ffffffffffffff68,
                                               (char *)in_stack_ffffffffffffff60);
                            if (uVar2 == '\0') {
                              uVar2 = lodepng_chunk_type_equals
                                                ((uchar *)in_stack_ffffffffffffff68,
                                                 (char *)in_stack_ffffffffffffff60);
                              if (uVar2 == '\0') {
                                uVar2 = lodepng_chunk_type_equals
                                                  ((uchar *)in_stack_ffffffffffffff68,
                                                   (char *)in_stack_ffffffffffffff60);
                                if (uVar2 == '\0') {
                                  uVar2 = lodepng_chunk_type_equals
                                                    ((uchar *)in_stack_ffffffffffffff68,
                                                     (char *)in_stack_ffffffffffffff60);
                                  if (uVar2 == '\0') {
                                    uVar2 = lodepng_chunk_type_equals
                                                      ((uchar *)in_stack_ffffffffffffff68,
                                                       (char *)in_stack_ffffffffffffff60);
                                    if (uVar2 == '\0') {
                                      if ((*(int *)(in_RCX + 0x24) == 0) &&
                                         (uVar2 = lodepng_chunk_ancillary(local_40), uVar2 == '\0'))
                                      {
                                        *(undefined4 *)(in_RCX + 0x1f0) = 0x45;
                                        goto LAB_00168bcb;
                                      }
                                      uVar9 = 1;
                                      if (*(int *)(in_RCX + 0x34) == 0) goto LAB_00168b69;
                                      uVar3 = lodepng_chunk_append
                                                        ((uchar **)CONCAT44(1,uVar8),
                                                         (size_t *)
                                                         CONCAT44(in_stack_ffffffffffffff84,
                                                                  in_stack_ffffffffffffff80),
                                                         (uchar *)in_stack_ffffffffffffff78);
                                      *(uint *)(in_RCX + 0x1f0) = uVar3;
                                      iVar4 = *(int *)(in_RCX + 0x1f0);
                                    }
                                    else {
                                      uVar3 = readChunk_iCCP((LodePNGInfo *)CONCAT44(uVar9,uVar8),
                                                             (LodePNGDecompressSettings *)
                                                             CONCAT44(in_stack_ffffffffffffff84,
                                                                      in_stack_ffffffffffffff80),
                                                             (uchar *)in_stack_ffffffffffffff78,
                                                             (size_t)in_stack_ffffffffffffff70);
                                      *(uint *)(in_RCX + 0x1f0) = uVar3;
                                      iVar4 = *(int *)(in_RCX + 0x1f0);
                                    }
                                  }
                                  else {
                                    uVar3 = readChunk_sRGB((LodePNGInfo *)(in_RCX + 0xb8),
                                                           (uchar *)in_stack_ffffffffffffff78,
                                                           (ulong)in_stack_ffffffffffffff84);
                                    *(uint *)(in_RCX + 0x1f0) = uVar3;
                                    iVar4 = *(int *)(in_RCX + 0x1f0);
                                  }
                                }
                                else {
                                  uVar3 = readChunk_cHRM((LodePNGInfo *)(in_RCX + 0xb8),
                                                         (uchar *)in_stack_ffffffffffffff78,
                                                         (ulong)in_stack_ffffffffffffff84);
                                  *(uint *)(in_RCX + 0x1f0) = uVar3;
                                  iVar4 = *(int *)(in_RCX + 0x1f0);
                                }
                              }
                              else {
                                uVar3 = readChunk_gAMA((LodePNGInfo *)(in_RCX + 0xb8),
                                                       (uchar *)in_stack_ffffffffffffff78,
                                                       (ulong)in_stack_ffffffffffffff84);
                                *(uint *)(in_RCX + 0x1f0) = uVar3;
                                iVar4 = *(int *)(in_RCX + 0x1f0);
                              }
                            }
                            else {
                              uVar3 = readChunk_pHYs((LodePNGInfo *)(in_RCX + 0xb8),
                                                     (uchar *)in_stack_ffffffffffffff78,
                                                     (ulong)in_stack_ffffffffffffff84);
                              *(uint *)(in_RCX + 0x1f0) = uVar3;
                              iVar4 = *(int *)(in_RCX + 0x1f0);
                            }
                          }
                          else {
                            uVar3 = readChunk_tIME((LodePNGInfo *)(in_RCX + 0xb8),
                                                   (uchar *)in_stack_ffffffffffffff78,
                                                   (ulong)in_stack_ffffffffffffff84);
                            *(uint *)(in_RCX + 0x1f0) = uVar3;
                            iVar4 = *(int *)(in_RCX + 0x1f0);
                          }
                        }
                        else {
                          if (*(int *)(in_RCX + 0x30) == 0) goto LAB_00168b69;
                          uVar3 = readChunk_iTXt(info_01,zlibsettings_00,(uchar *)info_00,
                                                 (size_t)zlibsettings);
                          *(uint *)(in_RCX + 0x1f0) = uVar3;
                          iVar4 = *(int *)(in_RCX + 0x1f0);
                        }
                      }
                      else {
                        if (*(int *)(in_RCX + 0x30) == 0) goto LAB_00168b69;
                        uVar3 = readChunk_zTXt(info_00,(LodePNGDecompressSettings *)zlibsettings,
                                               (uchar *)info,CONCAT44(uVar9,uVar8));
                        *(uint *)(in_RCX + 0x1f0) = uVar3;
                        iVar4 = *(int *)(in_RCX + 0x1f0);
                      }
                    }
                    else {
                      if (*(int *)(in_RCX + 0x30) == 0) goto LAB_00168b69;
                      uVar3 = readChunk_tEXt(info,(uchar *)CONCAT44(uVar9,uVar8),
                                             CONCAT44(in_stack_ffffffffffffff84,
                                                      in_stack_ffffffffffffff80));
                      *(uint *)(in_RCX + 0x1f0) = uVar3;
                      iVar4 = *(int *)(in_RCX + 0x1f0);
                    }
                  }
                  else {
                    uVar3 = readChunk_bKGD((LodePNGInfo *)(in_RCX + 0xb8),
                                           (uchar *)in_stack_ffffffffffffff78,
                                           (ulong)in_stack_ffffffffffffff84);
                    *(uint *)(in_RCX + 0x1f0) = uVar3;
                    iVar4 = *(int *)(in_RCX + 0x1f0);
                  }
                }
                else {
                  uVar3 = readChunk_tRNS((LodePNGColorMode *)(in_RCX + 200),
                                         (uchar *)in_stack_ffffffffffffff78,
                                         (ulong)in_stack_ffffffffffffff84);
                  *(uint *)(in_RCX + 0x1f0) = uVar3;
                  iVar4 = *(int *)(in_RCX + 0x1f0);
                }
                if (iVar4 != 0) goto LAB_00168bcb;
              }
              else {
                uVar3 = readChunk_PLTE(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                       CONCAT17(bVar7,in_stack_ffffffffffffff58));
                *(uint *)(in_RCX + 0x1f0) = uVar3;
                if (*(int *)(in_RCX + 0x1f0) != 0) goto LAB_00168bcb;
                uVar8 = 2;
              }
            }
            else {
              bVar1 = true;
            }
          }
          else {
            iVar4 = lodepng_addofl((size_t)info_01,(ulong)in_stack_ffffffffffffff84,
                                   (size_t *)&stack0xffffffffffffff70);
            if (iVar4 != 0) {
              *(undefined4 *)(in_RCX + 0x1f0) = 0x5f;
              goto LAB_00168bcb;
            }
            if (in_R9 < in_stack_ffffffffffffff70) {
              *(undefined4 *)(in_RCX + 0x1f0) = 0x5f;
              goto LAB_00168bcb;
            }
            lodepng_memcpy((void *)((long)pvVar5 + (long)info_01),in_stack_ffffffffffffff78,
                           (ulong)in_stack_ffffffffffffff84);
            info_01 = (LodePNGInfo *)
                      ((long)&info_01->compression_method + (ulong)in_stack_ffffffffffffff84);
            uVar8 = 3;
          }
LAB_00168b69:
          if (((*(int *)(in_RCX + 0x20) == 0) && (uVar9 == 0)) &&
             (uVar3 = lodepng_chunk_check_crc((uchar *)in_stack_ffffffffffffff68), uVar3 != 0)) {
            *(undefined4 *)(in_RCX + 0x1f0) = 0x39;
LAB_00168bcb:
            if ((*(int *)(in_RCX + 200) == 3) && (*(long *)(in_RCX + 0xd0) == 0)) {
              *(undefined4 *)(in_RCX + 0x1f0) = 0x6a;
            }
            if (*(int *)(in_RCX + 0x1f0) == 0) {
              if (*(int *)(in_RCX + 0xc0) == 0) {
                uVar3 = lodepng_get_bpp((LodePNGColorMode *)0x168c3e);
                zlibsettings = (LodePNGInfo *)lodepng_get_raw_size_idat(*in_RSI,*in_RDX,uVar3);
              }
              else {
                uVar3 = lodepng_get_bpp((LodePNGColorMode *)0x168c87);
                in_stack_ffffffffffffff60 = (uchar *)(ulong)uVar3;
                lVar10 = 0;
                sVar6 = lodepng_get_raw_size_idat(*in_RSI + 7 >> 3,*in_RDX + 7 >> 3,uVar3);
                lVar10 = sVar6 + lVar10;
                if (4 < *in_RSI) {
                  sVar6 = lodepng_get_raw_size_idat
                                    (*in_RSI + 3 >> 3,*in_RDX + 7 >> 3,
                                     (uint)in_stack_ffffffffffffff60);
                  lVar10 = sVar6 + lVar10;
                }
                sVar6 = lodepng_get_raw_size_idat
                                  (*in_RSI + 3 >> 2,*in_RDX + 3 >> 3,(uint)in_stack_ffffffffffffff60
                                  );
                lVar10 = sVar6 + lVar10;
                if (2 < *in_RSI) {
                  sVar6 = lodepng_get_raw_size_idat
                                    (*in_RSI + 1 >> 2,*in_RDX + 3 >> 2,
                                     (uint)in_stack_ffffffffffffff60);
                  lVar10 = sVar6 + lVar10;
                }
                sVar6 = lodepng_get_raw_size_idat
                                  (*in_RSI + 1 >> 1,*in_RDX + 1 >> 2,(uint)in_stack_ffffffffffffff60
                                  );
                lVar10 = sVar6 + lVar10;
                if (1 < *in_RSI) {
                  sVar6 = lodepng_get_raw_size_idat
                                    (*in_RSI >> 1,*in_RDX + 1 >> 1,(uint)in_stack_ffffffffffffff60);
                  lVar10 = sVar6 + lVar10;
                }
                sVar6 = lodepng_get_raw_size_idat
                                  (*in_RSI,*in_RDX >> 1,(uint)in_stack_ffffffffffffff60);
                zlibsettings = (LodePNGInfo *)(sVar6 + lVar10);
              }
              uVar9 = zlib_decompress((uchar **)zlibsettings,(size_t *)info,CONCAT44(uVar9,uVar8),
                                      (uchar *)CONCAT44(in_stack_ffffffffffffff84,
                                                        in_stack_ffffffffffffff80),
                                      (size_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
              *(uint *)(in_RCX + 0x1f0) = uVar9;
            }
            if ((*(int *)(in_RCX + 0x1f0) == 0) && (info_00 != zlibsettings)) {
              *(undefined4 *)(in_RCX + 0x1f0) = 0x5b;
            }
            lodepng_free((void *)0x168ea0);
            if (*(int *)(in_RCX + 0x1f0) == 0) {
              info = (LodePNGInfo *)
                     lodepng_get_raw_size
                               ((uint)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                (uint)in_stack_ffffffffffffff60,
                                (LodePNGColorMode *)CONCAT17(bVar7,in_stack_ffffffffffffff58));
              pvVar5 = lodepng_malloc(0x168eec);
              *in_RDI = (long)pvVar5;
              if (*in_RDI == 0) {
                *(undefined4 *)(in_RCX + 0x1f0) = 0x53;
              }
            }
            if (*(int *)(in_RCX + 0x1f0) == 0) {
              lodepng_memset((void *)*in_RDI,0,(size_t)info);
              uVar9 = postProcessScanlines
                                ((uchar *)w,(uchar *)h,state._4_4_,(uint)state,(LodePNGInfo *)in);
              *(uint *)(in_RCX + 0x1f0) = uVar9;
            }
            lodepng_free((void *)0x168f96);
            return;
          }
          if (!bVar1) {
            local_40 = lodepng_chunk_next_const
                                 ((uchar *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          }
        } while( true );
      }
      *(undefined4 *)(in_RCX + 0x1f0) = 0x53;
    }
    else {
      *(undefined4 *)(in_RCX + 0x1f0) = 0x5c;
    }
  }
  return;
}

Assistant:

static void decodeGeneric(unsigned char** out, unsigned* w, unsigned* h,
  LodePNGState* state,
  const unsigned char* in, size_t insize) {
  unsigned char IEND = 0;
  const unsigned char* chunk;
  unsigned char* idat; /*the data from idat chunks, zlib compressed*/
  size_t idatsize = 0;
  unsigned char* scanlines = 0;
  size_t scanlines_size = 0, expected_size = 0;
  size_t outsize = 0;

  /*for unknown chunk order*/
  unsigned unknown = 0;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  unsigned critical_pos = 1; /*1 = after IHDR, 2 = after PLTE, 3 = after IDAT*/
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/


  /* safe output values in case error happens */
  * out = 0;
  *w = *h = 0;

  state->error = lodepng_inspect(w, h, state, in, insize); /*reads header and resets other parameters in state->info_png*/
  if (state->error) return;

  if (lodepng_pixel_overflow(*w, *h, &state->info_png.color, &state->info_raw)) {
    CERROR_RETURN(state->error, 92); /*overflow possible due to amount of pixels*/
  }

  /*the input filesize is a safe upper bound for the sum of idat chunks size*/
  idat = (unsigned char*)lodepng_malloc(insize);
  if (!idat) CERROR_RETURN(state->error, 83); /*alloc fail*/

  chunk = &in[33]; /*first byte of the first chunk after the header*/

  /*loop through the chunks, ignoring unknown chunks and stopping at IEND chunk.
  IDAT data is put at the start of the in buffer*/
  while (!IEND && !state->error) {
    unsigned chunkLength;
    const unsigned char* data; /*the data in the chunk*/

    /*error: size of the in buffer too small to contain next chunk*/
    if ((size_t)((chunk - in) + 12) > insize || chunk < in) {
      if (state->decoder.ignore_end) break; /*other errors may still happen though*/
      CERROR_BREAK(state->error, 30);
    }

    /*length of the data of the chunk, excluding the length bytes, chunk type and CRC bytes*/
    chunkLength = lodepng_chunk_length(chunk);
    /*error: chunk length larger than the max PNG chunk size*/
    if (chunkLength > 2147483647) {
      if (state->decoder.ignore_end) break; /*other errors may still happen though*/
      CERROR_BREAK(state->error, 63);
    }

    if ((size_t)((chunk - in) + chunkLength + 12) > insize || (chunk + chunkLength + 12) < in) {
      CERROR_BREAK(state->error, 64); /*error: size of the in buffer too small to contain next chunk*/
    }

    data = lodepng_chunk_data_const(chunk);

    unknown = 0;

    /*IDAT chunk, containing compressed image data*/
    if (lodepng_chunk_type_equals(chunk, "IDAT")) {
      size_t newsize;
      if (lodepng_addofl(idatsize, chunkLength, &newsize)) CERROR_BREAK(state->error, 95);
      if (newsize > insize) CERROR_BREAK(state->error, 95);
      lodepng_memcpy(idat + idatsize, data, chunkLength);
      idatsize += chunkLength;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      critical_pos = 3;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    }
    else if (lodepng_chunk_type_equals(chunk, "IEND")) {
      /*IEND chunk*/
      IEND = 1;
    }
    else if (lodepng_chunk_type_equals(chunk, "PLTE")) {
      /*palette chunk (PLTE)*/
      state->error = readChunk_PLTE(&state->info_png.color, data, chunkLength);
      if (state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      critical_pos = 2;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    }
    else if (lodepng_chunk_type_equals(chunk, "tRNS")) {
      /*palette transparency chunk (tRNS). Even though this one is an ancillary chunk , it is still compiled
      in without 'LODEPNG_COMPILE_ANCILLARY_CHUNKS' because it contains essential color information that
      affects the alpha channel of pixels. */
      state->error = readChunk_tRNS(&state->info_png.color, data, chunkLength);
      if (state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      /*background color chunk (bKGD)*/
    }
    else if (lodepng_chunk_type_equals(chunk, "bKGD")) {
      state->error = readChunk_bKGD(&state->info_png, data, chunkLength);
      if (state->error) break;
    }
    else if (lodepng_chunk_type_equals(chunk, "tEXt")) {
      /*text chunk (tEXt)*/
      if (state->decoder.read_text_chunks) {
        state->error = readChunk_tEXt(&state->info_png, data, chunkLength);
        if (state->error) break;
      }
    }
    else if (lodepng_chunk_type_equals(chunk, "zTXt")) {
      /*compressed text chunk (zTXt)*/
      if (state->decoder.read_text_chunks) {
        state->error = readChunk_zTXt(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
        if (state->error) break;
      }
    }
    else if (lodepng_chunk_type_equals(chunk, "iTXt")) {
      /*international text chunk (iTXt)*/
      if (state->decoder.read_text_chunks) {
        state->error = readChunk_iTXt(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
        if (state->error) break;
      }
    }
    else if (lodepng_chunk_type_equals(chunk, "tIME")) {
      state->error = readChunk_tIME(&state->info_png, data, chunkLength);
      if (state->error) break;
    }
    else if (lodepng_chunk_type_equals(chunk, "pHYs")) {
      state->error = readChunk_pHYs(&state->info_png, data, chunkLength);
      if (state->error) break;
    }
    else if (lodepng_chunk_type_equals(chunk, "gAMA")) {
      state->error = readChunk_gAMA(&state->info_png, data, chunkLength);
      if (state->error) break;
    }
    else if (lodepng_chunk_type_equals(chunk, "cHRM")) {
      state->error = readChunk_cHRM(&state->info_png, data, chunkLength);
      if (state->error) break;
    }
    else if (lodepng_chunk_type_equals(chunk, "sRGB")) {
      state->error = readChunk_sRGB(&state->info_png, data, chunkLength);
      if (state->error) break;
    }
    else if (lodepng_chunk_type_equals(chunk, "iCCP")) {
      state->error = readChunk_iCCP(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
      if (state->error) break;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    }
    else /*it's not an implemented chunk type, so ignore it: skip over the data*/ {
      /*error: unknown critical chunk (5th bit of first byte of chunk type is 0)*/
      if (!state->decoder.ignore_critical && !lodepng_chunk_ancillary(chunk)) {
        CERROR_BREAK(state->error, 69);
      }

      unknown = 1;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      if (state->decoder.remember_unknown_chunks) {
        state->error = lodepng_chunk_append(&state->info_png.unknown_chunks_data[critical_pos - 1],
          &state->info_png.unknown_chunks_size[critical_pos - 1], chunk);
        if (state->error) break;
      }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    }

    if (!state->decoder.ignore_crc && !unknown) /*check CRC if wanted, only on known chunk types*/ {
      if (lodepng_chunk_check_crc(chunk)) CERROR_BREAK(state->error, 57); /*invalid CRC*/
    }

    if (!IEND) chunk = lodepng_chunk_next_const(chunk, in + insize);
  }

  if (state->info_png.color.colortype == LCT_PALETTE && !state->info_png.color.palette) {
    state->error = 106; /* error: PNG file must have PLTE chunk if color type is palette */
  }

  if (!state->error) {
    /*predict output size, to allocate exact size for output buffer to avoid more dynamic allocation.
    If the decompressed size does not match the prediction, the image must be corrupt.*/
    if (state->info_png.interlace_method == 0) {
      size_t bpp = lodepng_get_bpp(&state->info_png.color);
      expected_size = lodepng_get_raw_size_idat(*w, *h, bpp);
    }
    else {
      size_t bpp = lodepng_get_bpp(&state->info_png.color);
      /*Adam-7 interlaced: expected size is the sum of the 7 sub-images sizes*/
      expected_size = 0;
      expected_size += lodepng_get_raw_size_idat((*w + 7) >> 3, (*h + 7) >> 3, bpp);
      if (*w > 4) expected_size += lodepng_get_raw_size_idat((*w + 3) >> 3, (*h + 7) >> 3, bpp);
      expected_size += lodepng_get_raw_size_idat((*w + 3) >> 2, (*h + 3) >> 3, bpp);
      if (*w > 2) expected_size += lodepng_get_raw_size_idat((*w + 1) >> 2, (*h + 3) >> 2, bpp);
      expected_size += lodepng_get_raw_size_idat((*w + 1) >> 1, (*h + 1) >> 2, bpp);
      if (*w > 1) expected_size += lodepng_get_raw_size_idat((*w + 0) >> 1, (*h + 1) >> 1, bpp);
      expected_size += lodepng_get_raw_size_idat((*w + 0), (*h + 0) >> 1, bpp);
    }

    state->error = zlib_decompress(&scanlines, &scanlines_size, expected_size, idat, idatsize, &state->decoder.zlibsettings);
  }
  if (!state->error && scanlines_size != expected_size) state->error = 91; /*decompressed size doesn't match prediction*/
  lodepng_free(idat);

  if (!state->error) {
    outsize = lodepng_get_raw_size(*w, *h, &state->info_png.color);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if (!*out) state->error = 83; /*alloc fail*/
  }
  if (!state->error) {
    lodepng_memset(*out, 0, outsize);
    state->error = postProcessScanlines(*out, scanlines, *w, *h, &state->info_png);
  }
  lodepng_free(scanlines);
}